

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

_Bool op_ldrd_ri(DisasContext_conflict1 *s,arg_ldst_ri *a,int rt2)

{
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGTemp *pTVar1;
  ARMMMUIdx index;
  
  s_00 = s->uc->tcg_ctx;
  index = s->mmu_idx & 0xf;
  a32 = op_addr_ri_pre(s,a);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  gen_aa32_ld_i32(s,(TCGv_i32)((long)pTVar1 - (long)s_00),a32,index,s->be_data | MO_32);
  store_reg(s,a->rt,(TCGv_i32)((long)pTVar1 - (long)s_00));
  tcg_gen_addi_i32_aarch64(s_00,a32,a32,4);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  gen_aa32_ld_i32(s,(TCGv_i32)((long)pTVar1 - (long)s_00),a32,index,s->be_data | MO_32);
  store_reg(s,rt2,(TCGv_i32)((long)pTVar1 - (long)s_00));
  op_addr_ri_post(s,a,a32,-4);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_ldrd_ri(DisasContext *s, arg_ldst_ri *a, int rt2)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int mem_idx = get_mem_index(s);
    TCGv_i32 addr, tmp;

    addr = op_addr_ri_pre(s, a);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, a->rt, tmp);

    tcg_gen_addi_i32(tcg_ctx, addr, addr, 4);

    tmp = tcg_temp_new_i32(tcg_ctx);
    gen_aa32_ld_i32(s, tmp, addr, mem_idx, MO_UL | s->be_data);
    store_reg(s, rt2, tmp);

    /* LDRD w/ base writeback is undefined if the registers overlap.  */
    op_addr_ri_post(s, a, addr, -4);
    return true;
}